

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::BufferRenderInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,BufferRenderInstance *this,
          ConstPixelBufferAccess *result)

{
  TextureFormat TVar1;
  TestLog *log;
  bool bVar2;
  void *data;
  Surface reference;
  ConstPixelBufferAccess local_90;
  TextureFormat local_68;
  Surface local_60;
  Vec4 local_48;
  Vec4 local_38;
  
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 1.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 1.0;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::Surface::Surface
            (&local_60,
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[0],
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[1]);
  local_68.order = RGBA;
  local_68.type = UNORM_INT8;
  data = (void *)local_60.m_pixels.m_cap;
  if ((void *)local_60.m_pixels.m_cap != (void *)0x0) {
    data = local_60.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_90,&local_68,local_60.m_width,local_60.m_height,1,data);
  drawQuadrantReferenceResult
            ((PixelBufferAccess *)&local_90,&local_48,&local_38,&local_38,&local_48);
  log = ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
        m_context)->m_testCtx->m_log;
  local_68.order = RGBA;
  local_68.type = UNORM_INT8;
  if ((void *)local_60.m_pixels.m_cap != (void *)0x0) {
    local_60.m_pixels.m_cap = (size_t)local_60.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_90,&local_68,local_60.m_width,local_60.m_height,1,
             (void *)local_60.m_pixels.m_cap);
  bVar2 = tcu::bilinearCompare
                    (log,"Compare","Result comparison",&local_90,result,(RGBA)0x1010101,
                     COMPARE_LOG_RESULT);
  TVar1 = (TextureFormat)(local_90.m_size.m_data + 2);
  local_90.m_format = TVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_90.m_format,
               (undefined1 *)(local_90.m_size.m_data._0_8_ + (long)local_90.m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Image verification failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_90.m_format,
               (undefined1 *)(local_90.m_size.m_data._0_8_ + (long)local_90.m_format));
  }
  if (local_90.m_format != TVar1) {
    operator_delete((void *)local_90.m_format,local_90._16_8_ + 1);
  }
  tcu::Surface::~Surface(&local_60);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferRenderInstance::verifyResultImage (const tcu::ConstPixelBufferAccess& result) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	tcu::Surface		reference	(m_targetSize.x(), m_targetSize.y());

	drawQuadrantReferenceResult(reference.getAccess(), yellow, green, green, yellow);

	if (!bilinearCompare(m_context.getTestContext().getLog(), "Compare", "Result comparison", reference.getAccess(), result, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_RESULT))
		return tcu::TestStatus::fail("Image verification failed");
	else
		return tcu::TestStatus::pass("Pass");
}